

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_connection_free(PacketProtocolLayer *ppl)

{
  ssh2_channel *c_00;
  X11FakeAuth *auth_00;
  ssh_rportfwd *rpf_00;
  ssh_rportfwd *rpf;
  ssh2_channel *c;
  X11FakeAuth *auth;
  ssh2_connection_state *s;
  PacketProtocolLayer *ppl_local;
  
  safefree(*(void **)&ppl[-3].remote_bugs);
  conf_free((Conf *)ppl[-2].selfptr);
  while (c_00 = (ssh2_channel *)delpos234((tree234 *)ppl[-2].logctx,0), c_00 != (ssh2_channel *)0x0)
  {
    ssh2_channel_free(c_00);
  }
  freetree234((tree234 *)ppl[-2].logctx);
  while (auth_00 = (X11FakeAuth *)delpos234((tree234 *)ppl[-2].interactor,0),
        auth_00 != (X11FakeAuth *)0x0) {
    if (auth_00->disp != (X11Display *)0x0) {
      x11_free_display(auth_00->disp);
    }
    x11_free_fake_auth(auth_00);
  }
  freetree234((tree234 *)ppl[-2].interactor);
  if (*(long *)&ppl[-2].remote_bugs != 0) {
    while (rpf_00 = (ssh_rportfwd *)delpos234(*(tree234 **)&ppl[-2].remote_bugs,0),
          rpf_00 != (ssh_rportfwd *)0x0) {
      free_rportfwd(rpf_00);
    }
    freetree234(*(tree234 **)&ppl[-2].remote_bugs);
  }
  portfwdmgr_free((PortFwdManager *)ppl[-1].vt);
  if (ppl[-1].in_pq != (PktInQueue *)0x0) {
    free_prompts((prompts_t *)ppl[-1].in_pq);
  }
  delete_callbacks_for_context(&ppl[-3].interactor);
  safefree(&ppl[-3].interactor);
  return;
}

Assistant:

static void ssh2_connection_free(PacketProtocolLayer *ppl)
{
    struct ssh2_connection_state *s =
        container_of(ppl, struct ssh2_connection_state, ppl);
    struct X11FakeAuth *auth;
    struct ssh2_channel *c;
    struct ssh_rportfwd *rpf;

    sfree(s->peer_verstring);

    conf_free(s->conf);

    while ((c = delpos234(s->channels, 0)) != NULL)
        ssh2_channel_free(c);
    freetree234(s->channels);

    while ((auth = delpos234(s->x11authtree, 0)) != NULL) {
        if (auth->disp)
            x11_free_display(auth->disp);
        x11_free_fake_auth(auth);
    }
    freetree234(s->x11authtree);

    if (s->rportfwds) {
        while ((rpf = delpos234(s->rportfwds, 0)) != NULL)
            free_rportfwd(rpf);
        freetree234(s->rportfwds);
    }
    portfwdmgr_free(s->portfwdmgr);

    if (s->antispoof_prompt)
        free_prompts(s->antispoof_prompt);

    delete_callbacks_for_context(s);

    sfree(s);
}